

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O2

void jsoncons::
     encode_traits<std::vector<std::tuple<std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  pointer val_00;
  undefined **local_38;
  
  local_38 = &PTR__ser_context_00997908;
  (*encoder->_vptr_basic_json_visitor[7])
            (encoder,((long)(val->
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(val->
                           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x58,0,&local_38,ec);
  if (ec->_M_value == 0) {
    val_00 = (val->
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      if (val_00 == (val->
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = &PTR__ser_context_00997908;
        (*encoder->_vptr_basic_json_visitor[8])(encoder,&local_38,ec);
        return;
      }
      encode_traits<std::tuple<std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>,char,void>
      ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (val_00,encoder,proto,ec);
      val_00 = val_00 + 1;
    } while (ec->_M_value == 0);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(val.size(),semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encode_traits<value_type,CharT>::encode(*it, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_array(ser_context(), ec);
        }